

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.h
# Opt level: O2

void __thiscall CMDPSTATE::~CMDPSTATE(CMDPSTATE *this)

{
  SBPL_Exception *this_00;
  
  if (this->PlannerSpecificData == (void *)0x0) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&(this->PredsID).super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::~_Vector_base
              (&(this->Actions).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>);
    return;
  }
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception
            (this_00,"ERROR: state deletion: planner specific data is not deleted");
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

~CMDPSTATE()
    {
        if (PlannerSpecificData != NULL) {
            const char* msg = "ERROR: state deletion: planner specific data is not deleted";
            SBPL_FPRINTF(stderr, "%s\n", msg);
            throw SBPL_Exception(msg);
        }
    }